

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void ppc6xx_tlb_invalidate_virt2
               (CPUPPCState_conflict2 *env,target_ulong eaddr,int is_code,int match_epn)

{
  target_ulong tVar1;
  int iVar2;
  uint uVar3;
  ppc6xx_tlb_t_conflict2 *ppVar4;
  target_ulong addr;
  int way;
  CPUPPCState_conflict2 *__mptr;
  
  for (way = 0; way < env->nb_ways; way = way + 1) {
    iVar2 = ppc6xx_tlb_getnum(env,eaddr,way,is_code);
    uVar3 = (uint)(env->tlb).tlb6[iVar2].pte0;
    if ((int)uVar3 < 0) {
      ppVar4 = (env->tlb).tlb6 + iVar2;
      tVar1 = ppVar4->EPN;
      addr = tVar1;
      if ((match_epn == 0) || (addr = eaddr, tVar1 == eaddr)) {
        ppVar4->pte0 = (ulong)(uVar3 & 0x7fffffff);
        tlb_flush_page_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,addr);
      }
    }
  }
  return;
}

Assistant:

static inline void ppc6xx_tlb_invalidate_virt2(CPUPPCState *env,
                                               target_ulong eaddr,
                                               int is_code, int match_epn)
{
#if !defined(FLUSH_ALL_TLBS)
    CPUState *cs = env_cpu(env);
    ppc6xx_tlb_t *tlb;
    int way, nr;

    /* Invalidate ITLB + DTLB, all ways */
    for (way = 0; way < env->nb_ways; way++) {
        nr = ppc6xx_tlb_getnum(env, eaddr, way, is_code);
        tlb = &env->tlb.tlb6[nr];
        if (pte_is_valid(tlb->pte0) && (match_epn == 0 || eaddr == tlb->EPN)) {
            LOG_SWTLB("TLB invalidate %d/%d " TARGET_FMT_lx "\n", nr,
                      env->nb_tlb, eaddr);
            pte_invalidate(&tlb->pte0);
            tlb_flush_page(cs, tlb->EPN);
        }
    }
#else
    /* XXX: PowerPC specification say this is valid as well */
    ppc6xx_tlb_invalidate_all(env);
#endif
}